

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O2

void ourWriteOut(OperationConfig *config,per_transfer *per,CURLcode per_result)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  FILE *pFVar4;
  int iVar5;
  CURLcode CVar6;
  char *pcVar7;
  void *pvVar8;
  FILE **ppFVar9;
  char *pcVar10;
  FILE *pFVar11;
  size_t __n;
  long lVar12;
  char *pcVar13;
  FILE *__stream;
  bool bVar14;
  size_t *psVar15;
  ulong __n_00;
  curl_header *header;
  dynbuf name;
  writeoutvar find;
  
  __stream = _stdout;
  pcVar10 = config->writeout;
  if (pcVar10 != (char *)0x0) {
    curlx_dyn_init(&name,0x18);
    bVar14 = false;
    bVar3 = false;
LAB_0011d94a:
    psVar15 = &name.toobig;
    if (!bVar14) {
      for (lVar12 = 0; cVar1 = pcVar10[lVar12], cVar1 == '%'; lVar12 = lVar12 + 2) {
        cVar2 = (pcVar10 + lVar12)[1];
        if (cVar2 != '{') {
          if (cVar2 == '\0') goto LAB_0011da03;
          if (cVar2 == '%') {
            iVar5 = 0x25;
            goto LAB_0011d9ec;
          }
          iVar5 = strncmp("header{",pcVar10 + lVar12 + 1,7);
          if (iVar5 == 0) {
            pcVar13 = pcVar10 + lVar12 + 8;
            pcVar7 = strchr(pcVar13,0x7d);
            if (pcVar7 == (char *)0x0) {
              fputs("%header{",__stream);
              bVar14 = false;
              pcVar10 = pcVar13;
            }
            else {
              __n = (((long)pcVar7 - (long)pcVar10) - lVar12) - 8;
              if (__n < 0x100) {
                memcpy(&find,pcVar13,__n);
                *(undefined1 *)((long)psVar15 + ((long)pcVar7 - (long)pcVar10)) = 0;
                iVar5 = curl_easy_header(per->curl,&find,0,1,0xffffffffffffffff,&header);
                if (iVar5 == 0) {
                  fputs(header->value,__stream);
                }
              }
              bVar14 = false;
              pcVar10 = pcVar7 + 1;
            }
            goto LAB_0011d94a;
          }
          iVar5 = strncmp("output{",pcVar10 + lVar12 + 1,7);
          if (iVar5 == 0) {
            pcVar7 = pcVar10 + lVar12 + 8;
            if (*pcVar7 == '>') {
              pcVar13 = "w";
              if (pcVar10[lVar12 + 9] == '>') {
                pcVar13 = "a";
                pcVar7 = pcVar10 + lVar12 + 10;
              }
            }
            else {
              pcVar13 = "w";
            }
            pcVar10 = strchr(pcVar7,0x7d);
            if (pcVar10 != (char *)0x0) {
              __n_00 = (long)pcVar10 - (long)pcVar7;
              pFVar4 = __stream;
              bVar14 = bVar3;
              if (__n_00 < 0x200) {
                memcpy(&find,pcVar7,__n_00);
                *(undefined1 *)((long)&find + __n_00) = 0;
                pFVar11 = fopen64((char *)&find,pcVar13);
                if ((pFVar11 != (FILE *)0x0) && (pFVar4 = pFVar11, bVar14 = true, bVar3)) {
                  fclose(__stream);
                }
              }
              bVar3 = bVar14;
              __stream = pFVar4;
              bVar14 = false;
              pcVar10 = pcVar10 + 1;
              goto LAB_0011d94a;
            }
            fputs("%output{",__stream);
          }
          else {
            fputc(0x25,__stream);
            pcVar7 = pcVar10 + lVar12 + 2;
            fputc((int)pcVar10[lVar12 + 1],__stream);
          }
          bVar14 = false;
          pcVar10 = pcVar7;
          goto LAB_0011d94a;
        }
        find.name = (char *)0x0;
        find.id = VAR_NONE;
        find.ci = CURLINFO_NONE;
        find.writefunc = (_func_int_FILE_ptr_writeoutvar_ptr_per_transfer_ptr_CURLcode__Bool *)0x0;
        pcVar7 = strchr(pcVar10 + lVar12,0x7d);
        if (pcVar7 != (char *)0x0) {
          curlx_dyn_reset(&name);
          CVar6 = curlx_dyn_addn(&name,pcVar10 + lVar12 + 2,
                                 (size_t)(pcVar7 + (-lVar12 - (long)pcVar10) + -2));
          if (CVar6 == CURLE_OK) {
            find.name = curlx_dyn_ptr(&name);
            pvVar8 = bsearch(&find,variables,0x48,0x18,matchvar);
            if (pvVar8 == (void *)0x0) goto LAB_0011dac5;
            iVar5 = *(int *)((long)pvVar8 + 8);
            if (iVar5 == 0xd) {
              headerJSON((FILE *)__stream,per);
              goto LAB_0011daee;
            }
            if (iVar5 == 0x27) {
              ourWriteOutJSON((FILE *)__stream,variables,0x48,per,per_result);
              bVar14 = false;
            }
            else {
              bVar14 = per_result == CURLE_OK;
              if (iVar5 != 0x2f) {
                if (iVar5 == 0x43) {
                  if (bVar3) {
                    fclose(__stream);
                  }
                  ppFVar9 = &tool_stderr;
                }
                else {
                  if (iVar5 != 0x44) {
                    (**(code **)((long)pvVar8 + 0x10))(__stream,pvVar8,per,per_result,0);
                    bVar14 = false;
                    goto LAB_0011daf3;
                  }
                  if (bVar3) {
                    fclose(__stream);
                  }
                  ppFVar9 = (FILE **)&stdout;
                }
                __stream = (FILE *)*ppFVar9;
                bVar3 = false;
                bVar14 = false;
              }
            }
          }
          else {
LAB_0011dac5:
            curl_mfprintf(tool_stderr,"curl: unknown --write-out variable: \'%.*s\'\n",
                          (((int)pcVar7 - (int)pcVar10) - (int)lVar12) + -2,pcVar10 + lVar12 + 2);
LAB_0011daee:
            bVar14 = false;
          }
LAB_0011daf3:
          pcVar10 = pcVar7 + 1;
          goto LAB_0011d94a;
        }
        fputs("%{",__stream);
        psVar15 = (size_t *)((long)psVar15 + -2);
      }
      if (cVar1 == '\0') goto LAB_0011ddb8;
      if (cVar1 == '\\') {
        cVar1 = pcVar10[lVar12 + 1];
        iVar5 = 0x5c;
        if (cVar1 != '\0') {
          if (cVar1 == 't') {
            iVar5 = 9;
          }
          else {
            iVar5 = 0xd;
            if (cVar1 != 'r') {
              if (cVar1 == 'n') {
                iVar5 = 10;
              }
              else {
                fputc(0x5c,__stream);
                iVar5 = (int)pcVar10[lVar12 + 1];
              }
            }
          }
LAB_0011d9ec:
          fputc(iVar5,__stream);
          bVar14 = false;
          pcVar10 = pcVar10 + lVar12 + 2;
          goto LAB_0011d94a;
        }
      }
      else {
LAB_0011da03:
        iVar5 = (int)cVar1;
      }
      fputc(iVar5,__stream);
      pcVar10 = pcVar10 + lVar12 + 1;
      bVar14 = false;
      goto LAB_0011d94a;
    }
LAB_0011ddb8:
    if (bVar3) {
      fclose(__stream);
    }
    curlx_dyn_free(&name);
  }
  return;
}

Assistant:

void ourWriteOut(struct OperationConfig *config, struct per_transfer *per,
                 CURLcode per_result)
{
  FILE *stream = stdout;
  const char *writeinfo = config->writeout;
  const char *ptr = writeinfo;
  bool done = FALSE;
  bool fclose_stream = FALSE;
  struct dynbuf name;

  if(!writeinfo)
    return;

  curlx_dyn_init(&name, MAX_WRITEOUT_NAME_LENGTH);
  while(ptr && *ptr && !done) {
    if('%' == *ptr && ptr[1]) {
      if('%' == ptr[1]) {
        /* an escaped %-letter */
        fputc('%', stream);
        ptr += 2;
      }
      else {
        /* this is meant as a variable to output */
        char *end;
        size_t vlen;
        if('{' == ptr[1]) {
          struct writeoutvar *wv = NULL;
          struct writeoutvar find = { 0 };
          end = strchr(ptr, '}');
          ptr += 2; /* pass the % and the { */
          if(!end) {
            fputs("%{", stream);
            continue;
          }
          vlen = end - ptr;

          curlx_dyn_reset(&name);
          if(!curlx_dyn_addn(&name, ptr, vlen)) {
            find.name = curlx_dyn_ptr(&name);
            wv = bsearch(&find,
                         variables, CURL_ARRAYSIZE(variables),
                         sizeof(variables[0]), matchvar);
          }
          if(wv) {
            switch(wv->id) {
            case VAR_ONERROR:
              if(per_result == CURLE_OK)
                /* this is not error so skip the rest */
                done = TRUE;
              break;
            case VAR_STDOUT:
              if(fclose_stream)
                fclose(stream);
              fclose_stream = FALSE;
              stream = stdout;
              break;
            case VAR_STDERR:
              if(fclose_stream)
                fclose(stream);
              fclose_stream = FALSE;
              stream = tool_stderr;
              break;
            case VAR_JSON:
              ourWriteOutJSON(stream, variables,
                              CURL_ARRAYSIZE(variables),
                              per, per_result);
              break;
            case VAR_HEADER_JSON:
              headerJSON(stream, per);
              break;
            default:
              (void)wv->writefunc(stream, wv, per, per_result, false);
              break;
            }
          }
          else {
            fprintf(tool_stderr,
                    "curl: unknown --write-out variable: '%.*s'\n",
                    (int)vlen, ptr);
          }
          ptr = end + 1; /* pass the end */
        }
        else if(!strncmp("header{", &ptr[1], 7)) {
          ptr += 8;
          end = strchr(ptr, '}');
          if(end) {
            char hname[256]; /* holds the longest header field name */
            struct curl_header *header;
            vlen = end - ptr;
            if(vlen < sizeof(hname)) {
              memcpy(hname, ptr, vlen);
              hname[vlen] = 0;
              if(CURLHE_OK == curl_easy_header(per->curl, hname, 0,
                                               CURLH_HEADER, -1, &header))
                fputs(header->value, stream);
            }
            ptr = end + 1;
          }
          else
            fputs("%header{", stream);
        }
        else if(!strncmp("output{", &ptr[1], 7)) {
          bool append = FALSE;
          ptr += 8;
          if((ptr[0] == '>') && (ptr[1] == '>')) {
            append = TRUE;
            ptr += 2;
          }
          end = strchr(ptr, '}');
          if(end) {
            char fname[512]; /* holds the longest filename */
            size_t flen = end - ptr;
            if(flen < sizeof(fname)) {
              FILE *stream2;
              memcpy(fname, ptr, flen);
              fname[flen] = 0;
              stream2 = fopen(fname, append ? FOPEN_APPENDTEXT :
                              FOPEN_WRITETEXT);
              if(stream2) {
                /* only change if the open worked */
                if(fclose_stream)
                  fclose(stream);
                stream = stream2;
                fclose_stream = TRUE;
              }
            }
            ptr = end + 1;
          }
          else
            fputs("%output{", stream);
        }
        else {
          /* illegal syntax, then just output the characters that are used */
          fputc('%', stream);
          fputc(ptr[1], stream);
          ptr += 2;
        }
      }
    }
    else if('\\' == *ptr && ptr[1]) {
      switch(ptr[1]) {
      case 'r':
        fputc('\r', stream);
        break;
      case 'n':
        fputc('\n', stream);
        break;
      case 't':
        fputc('\t', stream);
        break;
      default:
        /* unknown, just output this */
        fputc(*ptr, stream);
        fputc(ptr[1], stream);
        break;
      }
      ptr += 2;
    }
    else {
      fputc(*ptr, stream);
      ptr++;
    }
  }
  if(fclose_stream)
    fclose(stream);
  curlx_dyn_free(&name);
}